

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_internal.h
# Opt level: O0

void __thiscall FdbGcFunc::~FdbGcFunc(FdbGcFunc *this)

{
  FdbGcFunc *in_RDI;
  
  gcNow(in_RDI);
  std::function<void_()>::~function((function<void_()> *)0x1325c8);
  return;
}

Assistant:

~FdbGcFunc() { gcNow(); }